

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.c
# Opt level: O1

void Macro_smpsHeaderSFXChannel(uint arg_count,long *arg_array)

{
  long lVar1;
  uchar byte;
  long lVar2;
  uchar uVar3;
  char *message;
  
  if (arg_count < 4) {
    __assert_fail("arg_count >= 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Clownacy[P]smps2asm2bin/instruction.c"
                  ,0x1eb,"void Macro_smpsHeaderSFXChannel(unsigned int, long *)");
  }
  if (target_driver < 3) {
LAB_00103fe3:
    if (2 < target_driver) goto LAB_0010400e;
    lVar1 = *arg_array;
    lVar2 = LookupDictionary("cFM6");
    if (lVar1 != lVar2) goto LAB_0010400e;
    message = 
    "Error: Using channel ID of FM6 ($06) in Sonic 1 or Sonic 2 drivers is unsupported. Change it to another channel.\n"
    ;
  }
  else {
    lVar1 = *arg_array;
    lVar2 = LookupDictionary("cNoise");
    if (lVar1 != lVar2) goto LAB_00103fe3;
    message = 
    "Error: Using channel ID of cNoise ($E0) in Sonic 3 driver is dangerous. Fix the song so that it turns into a noise channel instead.\n"
    ;
  }
  PrintError(message);
LAB_0010400e:
  MemoryStream_WriteByte(output_stream,0x80);
  MemoryStream_WriteByte(output_stream,(uchar)*arg_array);
  CheckedChannelPointer(*(uint *)(arg_array + 1));
  byte = (uchar)arg_array[2];
  if ((*arg_array & 0x80) != 0) {
    if (source_driver < 3 && 2 < target_driver) {
      byte = byte + '\f';
    }
    else {
      uVar3 = byte + 0xf4;
      if (source_driver < 3) {
        uVar3 = byte;
      }
      if (target_driver < 3) {
        byte = uVar3;
      }
    }
  }
  MemoryStream_WriteByte(output_stream,byte);
  MemoryStream_WriteByte(output_stream,(uchar)arg_array[3]);
  return;
}

Assistant:

static void Macro_smpsHeaderSFXChannel(unsigned int arg_count, long arg_array[])
{
	assert(arg_count >= 4);

	if (target_driver >= 3 && arg_array[0] == LookupDictionary("cNoise"))
		PrintError("Error: Using channel ID of cNoise ($E0) in Sonic 3 driver is dangerous. Fix the song so that it turns into a noise channel instead.\n");
	else if (target_driver < 3 && arg_array[0] == LookupDictionary("cFM6"))
		PrintError("Error: Using channel ID of FM6 ($06) in Sonic 1 or Sonic 2 drivers is unsupported. Change it to another channel.\n");

	WriteByte(0x80);			// Playback-control
	WriteByte(arg_array[0]);		// Channel ID
	CheckedChannelPointer(arg_array[1]);	// Location
	WriteByte((arg_array[0] & 0x80) ? PSGPitchConvert(arg_array[2]) : arg_array[2]);	// Pitch
	WriteByte(arg_array[3]);		// Volume
}